

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomUrl::write(DomUrl *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QString local_30;
  long local_18;
  
  QVar1.field_0._4_4_ = in_register_00000034;
  QVar1.field_0._0_4_ = __fd;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_30.d.d = (Data *)0x0;
    local_30.d.ptr = L"url";
    local_30.d.size = 3;
  }
  else {
    QString::toLower_helper(&local_30);
  }
  QVar1.m_size = (size_t)local_30.d.ptr;
  QXmlStreamWriter::writeStartElement(QVar1);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->m_children & 1) != 0) {
    local_30.d.d = (Data *)0x0;
    local_30.d.ptr = L"string";
    local_30.d.size = 6;
    DomString::write(this->m_string,__fd,&local_30,__n);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomUrl::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("url") : tagName.toLower());

    if (m_children & String)
        m_string->write(writer, u"string"_s);

    writer.writeEndElement();
}